

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

StellaOutputProxy * __thiscall
stella::detail::StellaOutputProxy::operator<<
          (StellaOutputProxy *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj)

{
  if (this->pOut_ != (ostream *)0x0) {
    std::operator<<(this->pOut_,(string *)obj);
    std::ostream::flush();
  }
  return this;
}

Assistant:

StellaOutputProxy& operator<<(const T& obj)
    {
        if (pOut_)
            (*pOut_) << obj << std::flush;
        return *this;
    }